

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::Memory::Init(Memory *this,u64 dst_offset,DataSegment *src,u64 src_offset,u64 size)

{
  pointer puVar1;
  ulong uVar2;
  Enum EVar3;
  
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  EVar3 = Error;
  if ((((size + dst_offset <= uVar2) && (size <= uVar2)) && (dst_offset <= uVar2)) &&
     (src_offset <= src->size_ - size && size <= src->size_)) {
    EVar3 = Ok;
    if (size != 0) {
      memmove(puVar1 + dst_offset,
              (src->desc_->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start + src_offset,size);
      EVar3 = Ok;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result Memory::Init(u64 dst_offset,
                    const DataSegment& src,
                    u64 src_offset,
                    u64 size) {
  if (IsValidAccess(dst_offset, 0, size) &&
      src.IsValidRange(src_offset, size)) {
    std::copy(src.desc().data.begin() + src_offset,
              src.desc().data.begin() + src_offset + size,
#if WABT_BIG_ENDIAN
              data_.rbegin() + dst_offset);
#else
              data_.begin() + dst_offset);
#endif
    return Result::Ok;
  }
  return Result::Error;
}